

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QStringList * __thiscall
QRegularExpressionMatch::capturedTexts
          (QStringList *__return_storage_ptr__,QRegularExpressionMatch *this)

{
  int nth;
  long in_FS_OFFSET;
  QStringView QVar1;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve(__return_storage_ptr__,(long)((this->d).d.ptr)->capturedCount);
  if (0 < ((this->d).d.ptr)->capturedCount) {
    nth = 0;
    do {
      QVar1 = capturedView(this,nth);
      QString::QString(&local_40,(QChar *)QVar1.m_data,QVar1.m_size);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_40);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      nth = nth + 1;
    } while (nth < ((this->d).d.ptr)->capturedCount);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QRegularExpressionMatch::capturedTexts() const
{
    QStringList texts;
    texts.reserve(d->capturedCount);
    for (int i = 0; i < d->capturedCount; ++i)
        texts << captured(i);
    return texts;
}